

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q3a_heap_node_relation.cpp
# Opt level: O3

int main(void)

{
  istream *piVar1;
  long lVar2;
  char *pcVar3;
  int m;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105118) = 0;
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_34);
  std::istream::operator>>(piVar1,&local_38);
  if (local_38 != 0) {
    do {
      local_38 = local_38 + -1;
      piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_3c);
      std::istream::operator>>(piVar1,&local_40);
      if (local_3c == local_40) {
        lVar2 = 0x19;
        pcVar3 = "a and b are the same node";
LAB_001012b6:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      else {
        if (local_40 < local_3c) {
          do {
            local_3c = (local_3c - (local_3c + -1 >> 0x1f)) + -1 >> 1;
          } while (local_40 < local_3c);
          if (local_3c == local_40) {
            lVar2 = 0x15;
            pcVar3 = "b is an ancestor of a";
          }
          else {
LAB_001012a7:
            lVar2 = 0x17;
            pcVar3 = "a and b are not related";
          }
          goto LAB_001012b6;
        }
        if (local_3c < local_40) {
          do {
            local_40 = (local_40 - (local_40 + -1 >> 0x1f)) + -1 >> 1;
          } while (local_3c < local_40);
          if (local_40 != local_3c) goto LAB_001012a7;
          lVar2 = 0x15;
          pcVar3 = "a is an ancestor of b";
          goto LAB_001012b6;
        }
      }
    } while (local_38 != 0);
  }
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int m, n;
    cin >> m >> n;
    while (n--) {
        int a,b;
        cin >> a >> b;
        if (a == b) {
            cout << "a and b are the same node" << endl;
        } else if (a > b) {
            while (a > b) {
                a = (a - 1) / 2;
            }
            if (b == a)
                cout << "b is an ancestor of a" << endl;
            else
                cout << "a and b are not related" << endl;
        } else if (a < b) {
            while (b > a) {
                b = (b - 1) / 2;
            }
            if (b == a)
                cout << "a is an ancestor of b" << endl;
            else
                cout << "a and b are not related" << endl;
        }
    }
}